

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O2

void sprintf<unsigned_char*>(stringstream *oss,string *fmt,uchar *value)

{
  ostream *poVar1;
  char cVar2;
  pointer pcVar3;
  long lVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  runtime_error *this;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t afterpos;
  string local_58;
  uchar *local_38;
  
  poVar1 = (ostream *)(oss + 0x10);
  uVar12 = 0;
  while( true ) {
    if (fmt->_M_string_length <= uVar12) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"extra arguments provided to sprintf");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar3 = (fmt->_M_dataplus)._M_p;
    cVar2 = pcVar3[uVar12];
    uVar9 = uVar12;
    if ((cVar2 == '%') && (uVar9 = uVar12 + 1, pcVar3[uVar12 + 1] != '%')) break;
    std::operator<<(poVar1,cVar2);
    uVar12 = uVar9 + 1;
  }
  local_38 = value;
  uVar8 = std::__cxx11::string::find_first_of((char *)fmt,0x124d27);
  uVar12 = uVar9;
  if (uVar9 < uVar8) {
    uVar12 = uVar8;
  }
  bVar5 = false;
  for (; uVar10 = uVar12, uVar9 < uVar8; uVar9 = uVar9 + 1) {
    cVar2 = (fmt->_M_dataplus)._M_p[uVar9];
    if (cVar2 != ' ') {
      if (cVar2 == '0') {
        if (((byte)oss[*(long *)(*(long *)oss + -0x18) + 0x18] & 0x20) == 0) {
          std::operator<<(poVar1,0x30);
        }
      }
      else if (cVar2 == '+') {
        *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
             *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) | 0x800;
      }
      else if (cVar2 == '-') {
        *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
             *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) & 0xffffff4f | 0x20;
      }
      else {
        uVar10 = uVar9;
        if (cVar2 != '#') break;
        bVar5 = true;
      }
    }
  }
  std::__cxx11::string::substr((ulong)&local_58,(ulong)fmt);
  iVar7 = std::__cxx11::stoi(&local_58,&afterpos,10);
  std::__cxx11::string::~string((string *)&local_58);
  *(long *)(oss + *(long *)(*(long *)poVar1 + -0x18) + 0x20) = (long)iVar7;
  lVar11 = uVar10 + afterpos;
  bVar6 = (fmt->_M_dataplus)._M_p[lVar11];
  if (bVar6 == 0x2e) {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)fmt);
    iVar7 = std::__cxx11::stoi(&local_58,&afterpos,10);
    std::__cxx11::string::~string((string *)&local_58);
    *(long *)(oss + *(long *)(*(long *)poVar1 + -0x18) + 0x18) = (long)iVar7;
    bVar6 = (fmt->_M_dataplus)._M_p[lVar11 + 1 + afterpos];
  }
  if ((bVar6 | 0x20) == 0x78) {
    lVar11 = *(long *)poVar1;
    lVar4 = *(long *)(lVar11 + -0x18);
    *(uint *)(oss + lVar4 + 0x28) = *(uint *)(oss + lVar4 + 0x28) & 0xffffffb5 | 8;
    if (bVar5) {
      *(uint *)(oss + *(long *)(lVar11 + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(lVar11 + -0x18) + 0x28) | 0x200;
    }
  }
  std::operator<<(poVar1,(char *)local_38);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)fmt);
  sprintf((char *)oss,(char *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}